

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O2

void surv0_ctx_send(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  long lVar1;
  _Bool _Var2;
  int iVar3;
  nng_err result;
  nni_msg *m;
  size_t count;
  undefined8 *item;
  nni_time nVar4;
  
  lVar1 = *arg;
  m = nni_aio_get_msg(aio);
  count = nni_msg_len(m);
  iVar3 = nni_atomic_get((nni_atomic_int *)((long)arg + 0x74));
  mtx = (nni_mtx *)(lVar1 + 0x20);
  nni_mtx_lock(mtx);
  surv0_ctx_abort((surv0_ctx *)arg,0x14);
  result = nni_id_alloc32((nni_id_map *)(lVar1 + 0xd0),(uint32_t *)((long)arg + 8),arg);
  if (result != NNG_OK) {
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio,result);
    return;
  }
  nni_msg_header_clear(m);
  nni_msg_header_append_u32(m,*(uint32_t *)((long)arg + 8));
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  for (item = (undefined8 *)nni_list_first((nni_list *)(lVar1 + 8)); item != (undefined8 *)0x0;
      item = (undefined8 *)nni_list_next((nni_list *)(lVar1 + 8),item)) {
    if (*(char *)(item + 0x7f) == '\0') {
      *(undefined1 *)(item + 0x7f) = 1;
      nni_msg_clone(m);
      nni_aio_set_msg((nni_aio *)(item + 0xd),m);
      nni_pipe_send((nni_pipe *)*item,(nni_aio *)(item + 0xd));
    }
    else {
      _Var2 = nni_lmq_full((nni_lmq *)(item + 2));
      if (!_Var2) {
        nni_msg_clone(m);
        nni_lmq_put((nni_lmq *)(item + 2),m);
      }
    }
  }
  nVar4 = nni_clock();
  *(nni_time *)((long)arg + 0x78) = (long)iVar3 + nVar4;
  nni_mtx_unlock(mtx);
  nni_msg_free(m);
  nni_aio_finish(aio,NNG_OK,count);
  return;
}

Assistant:

static void
surv0_ctx_send(void *arg, nni_aio *aio)
{
	surv0_ctx   *ctx  = arg;
	surv0_sock  *sock = ctx->sock;
	surv0_pipe  *pipe;
	nni_msg     *msg = nni_aio_get_msg(aio);
	size_t       len = nni_msg_len(msg);
	nng_duration survey_time;
	int          rv;

	survey_time = nni_atomic_get(&ctx->survey_time);

	nni_mtx_lock(&sock->mtx);

	// Abort everything outstanding.
	surv0_ctx_abort(ctx, NNG_ECANCELED);

	// Allocate the new ID.
	if ((rv = nni_id_alloc32(&sock->surveys, &ctx->survey_id, ctx)) != 0) {
		nni_mtx_unlock(&sock->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_msg_header_clear(msg);
	nni_msg_header_append_u32(msg, (uint32_t) ctx->survey_id);

	// From this point, we're committed to success.  Note that we send
	// regardless of whether there are any pipes or not.  If no pipes,
	// then it just gets discarded.
	nni_aio_set_msg(aio, NULL);
	NNI_LIST_FOREACH (&sock->pipes, pipe) {

		// if the pipe isn't busy, then send this message direct.
		if (!pipe->busy) {
			pipe->busy = true;
			nni_msg_clone(msg);
			nni_aio_set_msg(&pipe->aio_send, msg);
			nni_pipe_send(pipe->pipe, &pipe->aio_send);
		} else if (!nni_lmq_full(&pipe->send_queue)) {
			nni_msg_clone(msg);
			nni_lmq_put(&pipe->send_queue, msg);
		}
	}

	// save the survey time, so we know the maximum timeout to use when
	// waiting for receive
	ctx->expire = nni_clock() + survey_time;

	nni_mtx_unlock(&sock->mtx);
	nni_msg_free(msg);

	nni_aio_finish(aio, 0, len);
}